

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O3

void __thiscall
Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>::Polynom
          (Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *this,Monom *m)

{
  initializer_list<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> cont;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> local_60;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> local_30;
  
  IntegerConstantType::IntegerConstantType
            ((IntegerConstantType *)&local_60,(IntegerConstantType *)m);
  IntegerConstantType::IntegerConstantType(&local_60.numeral._den,&(m->numeral)._den);
  local_60.factors._id = (m->factors)._id;
  local_60.factors._ptr = (m->factors)._ptr;
  cont._M_len = 1;
  cont._M_array = &local_60;
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Stack
            (&local_30,cont);
  Polynom(this,&local_30);
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::~Stack(&local_30);
  mpz_clear(local_60.numeral._den._val);
  mpz_clear((__mpz_struct *)&local_60);
  return;
}

Assistant:

Polynom<Number>::Polynom(Monom m) 
  : Polynom(
      Stack<Monom>{m})
{  }